

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_Noise(opm_t *chip)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte local_1b;
  uint8_t w4;
  uint8_t w3;
  uint8_t w2;
  uint8_t w2t;
  uint8_t xr;
  uint8_t w1;
  opm_t *chip_local;
  
  bVar2 = false;
  if (chip->ic == '\0') {
    bVar2 = chip->noise_update == '\0';
  }
  bVar3 = false;
  if ((chip->noise_lfsr & 0xffff) == 0xffff) {
    bVar3 = chip->noise_temp == '\0';
  }
  bVar1 = false;
  if ((chip->ic == '\0') && (bVar1 = false, !bVar2)) {
    bVar1 = bVar3 || ((byte)(chip->noise_lfsr >> 2) & 1) != chip->noise_temp;
  }
  if (((chip->noise_lfsr & 1) == 0) || (local_1b = 0, !bVar2)) {
    local_1b = bVar1 ^ 0xff;
  }
  if (!bVar2) {
    chip->noise_temp = (chip->noise_lfsr & 1) == 0;
  }
  chip->noise_lfsr = chip->noise_lfsr >> 1;
  chip->noise_lfsr = (uint)(local_1b & 1) << 0xf | chip->noise_lfsr;
  return;
}

Assistant:

static void OPM_Noise(opm_t *chip)
{
    uint8_t w1 = !chip->ic && !chip->noise_update;
    uint8_t xr = ((chip->noise_lfsr >> 2) & 1) ^ chip->noise_temp;
    uint8_t w2t = (chip->noise_lfsr & 0xffff) == 0xffff && chip->noise_temp == 0;
    uint8_t w2 = !w2t && !xr;
    uint8_t w3 = !chip->ic && !w1 && !w2;
    uint8_t w4 = ((chip->noise_lfsr & 1) == 0 || !w1) && !w3;
    if (!w1)
    {
        chip->noise_temp = (chip->noise_lfsr & 1) == 0;
    }
    chip->noise_lfsr >>= 1;
    chip->noise_lfsr |= w4 << 15;
}